

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall c4::yml::Parser::_stop_doc(Parser *this)

{
  size_t node;
  Tree *pTVar1;
  code *pcVar2;
  Location LVar3;
  undefined1 auVar4 [24];
  Location LVar5;
  bool bVar6;
  char msg [41];
  char local_a8 [28];
  undefined4 uStack_8c;
  undefined1 local_88;
  undefined7 uStack_87;
  undefined1 uStack_80;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  char *pcStack_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  char *pcStack_30;
  undefined8 local_28;
  
  node = this->m_state->node_id;
  pTVar1 = this->m_tree;
  if ((node == 0xffffffffffffffff) || (pTVar1->m_cap <= node)) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    local_a8[0] = '\0';
    local_a8[1] = '\0';
    local_a8[2] = '\0';
    local_a8[3] = '\0';
    local_a8[4] = '\0';
    local_a8[5] = '\0';
    local_a8[6] = '\0';
    local_a8[7] = '\0';
    local_a8[8] = -0x7a;
    local_a8[9] = 'K';
    local_a8[10] = '\0';
    local_a8[0xb] = '\0';
    local_a8[0xc] = '\0';
    local_a8[0xd] = '\0';
    local_a8[0xe] = '\0';
    local_a8[0xf] = '\0';
    local_a8[0x10] = '\0';
    local_a8[0x11] = '\0';
    local_a8[0x12] = '\0';
    local_a8[0x13] = '\0';
    local_a8[0x14] = '\0';
    local_a8[0x15] = '\0';
    local_a8[0x16] = '\0';
    local_a8[0x17] = '\0';
    local_a8[0x18] = -3;
    local_a8[0x19] = 'f';
    local_a8[0x1a] = '$';
    local_a8[0x1b] = '\0';
    uStack_8c = 0;
    local_88 = 0x65;
    uStack_87 = 0;
    (*(code *)PTR_error_impl_00297798)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  if ((pTVar1->m_buf[node].m_type.type & DOC) == NOTYPE) {
    local_88 = 99;
    uStack_87 = 0x292965646f6e5f;
    uStack_80 = 0;
    builtin_strncpy(local_a8 + 0x10,"_tree->is_do",0xc);
    uStack_8c = 0x6f642863;
    builtin_strncpy(local_a8,"check failed: (m",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    local_48 = 0;
    uStack_40 = 0x7783;
    local_38 = 0;
    pcStack_30 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_28 = 0x65;
    auVar4 = ZEXT1224(ZEXT412(0x7783) << 0x40);
    LVar3.name.str._0_4_ = 0x2466fd;
    LVar3.super_LineCol.offset = auVar4._0_8_;
    LVar3.super_LineCol.line = auVar4._8_8_;
    LVar3.super_LineCol.col = auVar4._16_8_;
    LVar3.name.str._4_4_ = 0;
    LVar3.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_a8,0x29,LVar3,(this->m_stack).m_callbacks.m_user_data);
  }
  pTVar1 = this->m_tree;
  if ((node == 0xffffffffffffffff) || (pTVar1->m_cap <= node)) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    local_a8[0] = '\0';
    local_a8[1] = '\0';
    local_a8[2] = '\0';
    local_a8[3] = '\0';
    local_a8[4] = '\0';
    local_a8[5] = '\0';
    local_a8[6] = '\0';
    local_a8[7] = '\0';
    local_a8[8] = -0x7a;
    local_a8[9] = 'K';
    local_a8[10] = '\0';
    local_a8[0xb] = '\0';
    local_a8[0xc] = '\0';
    local_a8[0xd] = '\0';
    local_a8[0xe] = '\0';
    local_a8[0xf] = '\0';
    local_a8[0x10] = '\0';
    local_a8[0x11] = '\0';
    local_a8[0x12] = '\0';
    local_a8[0x13] = '\0';
    local_a8[0x14] = '\0';
    local_a8[0x15] = '\0';
    local_a8[0x16] = '\0';
    local_a8[0x17] = '\0';
    local_a8[0x18] = -3;
    local_a8[0x19] = 'f';
    local_a8[0x1a] = '$';
    local_a8[0x1b] = '\0';
    uStack_8c = 0;
    local_88 = 0x65;
    uStack_87 = 0;
    (*(code *)PTR_error_impl_00297798)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  if ((pTVar1->m_buf[node].m_type.type & SEQ) == NOTYPE) {
    pTVar1 = this->m_tree;
    if ((node == 0xffffffffffffffff) || (pTVar1->m_cap <= node)) {
      if (((byte)s_error_flags & 1) != 0) {
        bVar6 = is_debugger_attached();
        if (bVar6) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
      }
      local_a8[0] = '\0';
      local_a8[1] = '\0';
      local_a8[2] = '\0';
      local_a8[3] = '\0';
      local_a8[4] = '\0';
      local_a8[5] = '\0';
      local_a8[6] = '\0';
      local_a8[7] = '\0';
      local_a8[8] = -0x7a;
      local_a8[9] = 'K';
      local_a8[10] = '\0';
      local_a8[0xb] = '\0';
      local_a8[0xc] = '\0';
      local_a8[0xd] = '\0';
      local_a8[0xe] = '\0';
      local_a8[0xf] = '\0';
      local_a8[0x10] = '\0';
      local_a8[0x11] = '\0';
      local_a8[0x12] = '\0';
      local_a8[0x13] = '\0';
      local_a8[0x14] = '\0';
      local_a8[0x15] = '\0';
      local_a8[0x16] = '\0';
      local_a8[0x17] = '\0';
      local_a8[0x18] = -3;
      local_a8[0x19] = 'f';
      local_a8[0x1a] = '$';
      local_a8[0x1b] = '\0';
      uStack_8c = 0;
      local_88 = 0x65;
      uStack_87 = 0;
      (*(code *)PTR_error_impl_00297798)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((pTVar1->m_buf[node].m_type.type & MAP) == NOTYPE) {
      pTVar1 = this->m_tree;
      if ((node == 0xffffffffffffffff) || (pTVar1->m_cap <= node)) {
        if (((byte)s_error_flags & 1) != 0) {
          bVar6 = is_debugger_attached();
          if (bVar6) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
        }
        local_a8[0] = '\0';
        local_a8[1] = '\0';
        local_a8[2] = '\0';
        local_a8[3] = '\0';
        local_a8[4] = '\0';
        local_a8[5] = '\0';
        local_a8[6] = '\0';
        local_a8[7] = '\0';
        local_a8[8] = -0x7a;
        local_a8[9] = 'K';
        local_a8[10] = '\0';
        local_a8[0xb] = '\0';
        local_a8[0xc] = '\0';
        local_a8[0xd] = '\0';
        local_a8[0xe] = '\0';
        local_a8[0xf] = '\0';
        local_a8[0x10] = '\0';
        local_a8[0x11] = '\0';
        local_a8[0x12] = '\0';
        local_a8[0x13] = '\0';
        local_a8[0x14] = '\0';
        local_a8[0x15] = '\0';
        local_a8[0x16] = '\0';
        local_a8[0x17] = '\0';
        local_a8[0x18] = -3;
        local_a8[0x19] = 'f';
        local_a8[0x1a] = '$';
        local_a8[0x1b] = '\0';
        uStack_8c = 0;
        local_88 = 0x65;
        uStack_87 = 0;
        (*(code *)PTR_error_impl_00297798)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      if ((pTVar1->m_buf[node].m_type.type & KEYVAL) != VAL) {
        if ((this->m_state->flags & 0x200) != 0) {
          builtin_strncpy(local_a8 + 0x10,"as_none(SSCL",0xc);
          uStack_8c = CONCAT13(uStack_8c._3_1_,0x2929);
          builtin_strncpy(local_a8,"check failed: (h",0x10);
          if (((byte)s_error_flags & 1) != 0) {
            bVar6 = is_debugger_attached();
            if (bVar6) {
              pcVar2 = (code *)swi(3);
              (*pcVar2)();
              return;
            }
          }
          local_70 = 0;
          uStack_68 = 0x7786;
          local_60 = 0;
          pcStack_58 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_50 = 0x65;
          auVar4 = ZEXT1224(ZEXT412(0x7786) << 0x40);
          LVar5.name.str._0_4_ = 0x2466fd;
          LVar5.super_LineCol.offset = auVar4._0_8_;
          LVar5.super_LineCol.line = auVar4._8_8_;
          LVar5.super_LineCol.col = auVar4._16_8_;
          LVar5.name.str._4_4_ = 0;
          LVar5.name.len = 0x65;
          (*(this->m_stack).m_callbacks.m_error)
                    (local_a8,0x1f,LVar5,(this->m_stack).m_callbacks.m_user_data);
        }
        Tree::to_val(this->m_tree,node,(csubstr)ZEXT816(0),0x10);
      }
    }
  }
  return;
}

Assistant:

void Parser::_stop_doc()
{
    size_t doc_node = m_state->node_id;
    _c4dbgpf("stop_doc[{}]", doc_node);
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_tree->is_doc(doc_node));
    if(!m_tree->is_seq(doc_node) && !m_tree->is_map(doc_node) && !m_tree->is_val(doc_node))
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(SSCL));
        _c4dbgpf("stop_doc[{}]: there was nothing; adding null val", doc_node);
        m_tree->to_val(doc_node, {}, DOC);
    }
}